

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

int nn_trie_match(nn_trie *self,uint8_t *data,size_t size)

{
  byte bVar1;
  uint uVar2;
  nn_trie_node **ppnVar3;
  ulong uVar4;
  nn_trie_node *self_00;
  
  self_00 = self->root;
  do {
    if (self_00 == (nn_trie_node *)0x0) {
      return 0;
    }
    bVar1 = self_00->prefix_len;
    uVar4 = (ulong)(uint)bVar1;
    uVar2 = (uint)bVar1;
    if (bVar1 != 0) {
      uVar4 = 0;
      do {
        if (size == uVar4) {
          uVar4 = size & 0xffffffff;
          goto LAB_00126154;
        }
        if (self_00->prefix[uVar4] != data[uVar4]) goto LAB_00126154;
        uVar4 = uVar4 + 1;
      } while (bVar1 != uVar4);
      uVar4 = (ulong)uVar2;
    }
LAB_00126154:
    if ((uint)uVar4 != uVar2) {
      return 0;
    }
    if (self_00->refcount != 0) {
      return 1;
    }
    ppnVar3 = nn_node_next(self_00,data[uVar2]);
    if (ppnVar3 == (nn_trie_node **)0x0) {
      self_00 = (nn_trie_node *)0x0;
    }
    else {
      self_00 = *ppnVar3;
    }
    data = data + uVar2 + 1;
    size = size + ~(ulong)uVar2;
  } while( true );
}

Assistant:

int nn_trie_match (struct nn_trie *self, const uint8_t *data, size_t size)
{
    struct nn_trie_node *node;
    struct nn_trie_node **tmp;

    node = self->root;
    while (1) {

        /*  If we are at the end of the trie, return. */
        if (!node)
            return 0;

        /*  Check whether whole prefix matches the data. If not so,
            the whole string won't match. */
        if (nn_node_check_prefix (node, data, size) != node->prefix_len)
            return 0;

        /*  Skip the prefix. */
        data += node->prefix_len;
        size -= node->prefix_len;

        /*  If all the data are matched, return. */
        if (nn_node_has_subscribers (node))
            return 1;

        /*  Move to the next node. */
        tmp = nn_node_next (node, *data);
        node = tmp ? *tmp : NULL;
        ++data;
        --size;
    }
}